

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDec.c
# Opt level: O2

void Abc_TtStoreLoadSaveBin(char *pFileName)

{
  uint *puVar1;
  uint uVar2;
  void *__ptr;
  char *__s;
  char *__filename;
  FILE *__stream;
  FILE *__stream_00;
  char *pcVar3;
  size_t sVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  bool bVar9;
  uint local_54;
  
  __ptr = calloc(0x800,4);
  __s = (char *)calloc(0x10000,1);
  __filename = Extra_FileNameGenericAppend(pFileName,"_binary.data");
  __stream = fopen(pFileName,"rb");
  __stream_00 = fopen(__filename,"wb");
  if (__stream == (FILE *)0x0) {
    return;
  }
  uVar6 = 0xffffffff;
  do {
    pcVar3 = fgets(__s,0x10000,__stream);
    if (pcVar3 == (char *)0x0) {
      free(__ptr);
      free(__s);
      fclose(__stream);
      fclose(__stream_00);
      printf("Input file \"%s\" was copied into output file \"%s\".\n",pFileName,__filename);
      return;
    }
    sVar4 = strlen(__s);
    uVar7 = (int)sVar4 - 1;
    local_54 = uVar7;
    if (1 < uVar7) {
      local_54 = 0;
      for (uVar2 = (int)sVar4 - 2; uVar2 != 0; uVar2 = uVar2 >> 1) {
        local_54 = local_54 + 1;
      }
    }
    iVar8 = (((int)uVar7 >> 5) + 1) - (uint)((uVar7 & 0x1f) == 0);
    if (uVar7 != 1 << ((byte)local_54 & 0x1f)) {
      __assert_fail("Len == (1 << nVars)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDec.c"
                    ,0x1e8,"void Abc_TtStoreLoadSaveBin(char *)");
    }
    if ((uVar6 != 0xffffffff) && (bVar9 = uVar6 != local_54, local_54 = uVar6, bVar9)) {
      __assert_fail("nVarsAll == nVars",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDec.c"
                    ,0x1ec,"void Abc_TtStoreLoadSaveBin(char *)");
    }
    sVar4 = (long)iVar8 << 2;
    memset(__ptr,0,sVar4);
    if ((int)uVar7 < 1) {
      uVar7 = 0;
    }
    for (uVar5 = 0; uVar7 != uVar5; uVar5 = uVar5 + 1) {
      if (__s[uVar5] != '0') {
        if (__s[uVar5] != '1') {
          __assert_fail("pBuffer[i] == \'0\'",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDec.c"
                        ,0x1f2,"void Abc_TtStoreLoadSaveBin(char *)");
        }
        puVar1 = (uint *)((long)__ptr + (uVar5 >> 5 & 0x7ffffff) * 4);
        *puVar1 = *puVar1 | 1 << ((byte)uVar5 & 0x1f);
      }
    }
    sVar4 = fwrite(__ptr,1,sVar4,__stream_00);
    uVar6 = local_54;
  } while (iVar8 * 4 == (int)sVar4);
  __assert_fail("Value == (int)sizeof(int) * nInts",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDec.c"
                ,500,"void Abc_TtStoreLoadSaveBin(char *)");
}

Assistant:

void Abc_TtStoreLoadSaveBin( char * pFileName )
{ 
    unsigned * pTruth = ABC_CALLOC( unsigned, (1 << 11) );
    char * pBuffer = ABC_CALLOC( char, (1 << 16) );
    char * pFileInput  = pFileName;
    char * pFileOutput = Extra_FileNameGenericAppend(pFileName, "_binary.data");
    FILE * pFileI = fopen( pFileInput,  "rb" );
    FILE * pFileO = fopen( pFileOutput, "wb" );
    int i, Value, nVarsAll = -1;
    if ( pFileI == NULL )
        return;
    while ( fgets(pBuffer, (1 << 16), pFileI) )
    {
        int Len   = strlen(pBuffer)-1; // subtract 1 for end-of-line
        int nVars = Abc_Base2Log(Len);
        int nInts = Abc_BitWordNum(Len);
        assert( Len == (1 << nVars) );
        if ( nVarsAll == -1 )
            nVarsAll = nVars;
        else
            assert( nVarsAll == nVars );
        memset( pTruth, 0, sizeof(int)*nInts );
        for ( i = 0; i < Len; i++ )
            if ( pBuffer[i] == '1' )
                Abc_InfoSetBit( pTruth, i );
            else
                assert( pBuffer[i] == '0' );
        Value = fwrite( pTruth, 1, sizeof(int) * nInts, pFileO );
        assert( Value == (int)sizeof(int) * nInts );
    }
    ABC_FREE( pTruth );
    ABC_FREE( pBuffer );
    fclose( pFileI );
    fclose( pFileO );
    printf( "Input file \"%s\" was copied into output file \"%s\".\n", pFileInput, pFileOutput );
}